

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtIsOnArc.cpp
# Opt level: O0

bool GeoCalcs::PtIsOnArc(LLPoint *llArcCenter,double dArcRadius,double dArcStartAzimuth,
                        double dArcEndAzimuth,int nArcDirection,LLPoint *llTestPt,int *bOnArc)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dSubtendedAng2;
  double dSubtendedAng1;
  InverseResult invResult;
  int *bOnArc_local;
  LLPoint *llTestPt_local;
  int nArcDirection_local;
  double dArcEndAzimuth_local;
  double dArcStartAzimuth_local;
  double dArcRadius_local;
  LLPoint *llArcCenter_local;
  
  invResult.distance = (double)bOnArc;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&dSubtendedAng1);
  bVar3 = DistVincenty(llArcCenter,llTestPt,(InverseResult *)&dSubtendedAng1);
  if (bVar3) {
    *(undefined4 *)invResult.distance = 0;
    if (ABS(invResult.reverseAzimuth - dArcRadius) <= 0.0005) {
      dVar1 = GetArcExtent(dArcStartAzimuth,dArcEndAzimuth,nArcDirection,1e-09);
      if ((dVar1 != 6.283185307179586) || (NAN(dVar1))) {
        dVar2 = GetArcExtent(dArcStartAzimuth,dSubtendedAng1,nArcDirection,1e-09);
        if (nArcDirection < 1) {
          if (dVar1 <= dVar2) {
            *(undefined4 *)invResult.distance = 1;
          }
        }
        else if (dVar2 <= dVar1) {
          *(undefined4 *)invResult.distance = 1;
        }
      }
      else {
        *(undefined4 *)invResult.distance = 1;
      }
    }
    llArcCenter_local._7_1_ = true;
  }
  else {
    llArcCenter_local._7_1_ = false;
  }
  return llArcCenter_local._7_1_;
}

Assistant:

bool PtIsOnArc(const LLPoint &llArcCenter, double dArcRadius,
                   double dArcStartAzimuth, double dArcEndAzimuth, int nArcDirection,
                   const LLPoint &llTestPt, int &bOnArc)
    {
        InverseResult invResult;
        if (!DistVincenty(llArcCenter, llTestPt, invResult))
            return false;

        bOnArc = false;

        if (fabs(invResult.distance - dArcRadius) <= 0.5e-3)
        {
            const double dSubtendedAng1 = GetArcExtent(dArcStartAzimuth, dArcEndAzimuth, nArcDirection, kTol);

            if (dSubtendedAng1 == M_2PI)
                bOnArc = true;
            else
            {
                const double dSubtendedAng2 = GetArcExtent(dArcStartAzimuth, invResult.azimuth,
                                                     nArcDirection, kTol);

                if (nArcDirection > 0)
                {
                    if (dSubtendedAng2 <= dSubtendedAng1)
                        bOnArc = true;
                }
                else
                {
                    if (dSubtendedAng2 >= dSubtendedAng1)
                        bOnArc = true;
                }
            }
        }
        return true;
    }